

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void GetMinimumPhaseSpectrum(MinimumPhaseAnalysis *minimum_phase)

{
  int iVar1;
  double *pdVar2;
  fft_complex *padVar3;
  fft_plan p;
  fft_plan p_00;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  undefined8 unaff_RBX;
  ulong uVar8;
  fft_plan *pfVar9;
  undefined8 *puVar10;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  byte bVar11;
  double dVar12;
  double dVar13;
  double *unaff_retaddr;
  undefined8 auStackY_68 [5];
  undefined1 in_stack_ffffffffffffffc0 [32];
  undefined8 in_stack_ffffffffffffffe0;
  
  bVar11 = 0;
  iVar1 = minimum_phase->fft_size;
  iVar4 = iVar1 / 2 + 1;
  if (iVar4 < iVar1) {
    pdVar2 = minimum_phase->log_spectrum;
    lVar6 = (long)iVar4;
    lVar7 = ~(long)(iVar1 / 2) + (long)iVar1;
    do {
      pdVar2[lVar6] = pdVar2[lVar7];
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pfVar9 = &minimum_phase->inverse_fft;
  puVar10 = auStackY_68;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar10 = *(undefined8 *)pfVar9;
    pfVar9 = (fft_plan *)&pfVar9->flags;
    puVar10 = puVar10 + 1;
  }
  p.c_out = (fft_complex *)in_stack_ffffffffffffffe0;
  p.n = in_stack_ffffffffffffffc0._0_4_;
  p.sign = in_stack_ffffffffffffffc0._4_4_;
  p.flags = in_stack_ffffffffffffffc0._8_4_;
  p._12_4_ = in_stack_ffffffffffffffc0._12_4_;
  p.c_in = (fft_complex *)in_stack_ffffffffffffffc0._16_8_;
  p.in = (double *)in_stack_ffffffffffffffc0._24_8_;
  p.out = (double *)unaff_RBX;
  p.input = (double *)unaff_R14;
  p.ip = (int *)unaff_R15;
  p.w = unaff_retaddr;
  fft_execute(p);
  padVar3 = minimum_phase->cepstrum;
  (*padVar3)[1] = -(*padVar3)[1];
  iVar4 = minimum_phase->fft_size;
  uVar5 = iVar4 / 2;
  if (3 < iVar4) {
    uVar8 = 2;
    if (2 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
    }
    lVar6 = 0;
    do {
      dVar12 = *(double *)((long)padVar3[1] + lVar6);
      dVar13 = *(double *)((long)padVar3[1] + lVar6 + 8);
      *(double *)((long)padVar3[1] + lVar6) = dVar12 + dVar12;
      *(double *)((long)padVar3[1] + lVar6 + 8) = dVar13 * -2.0;
      lVar6 = lVar6 + 0x10;
    } while (uVar8 * 0x10 + -0x10 != lVar6);
  }
  padVar3[(int)uVar5][1] = -padVar3[(int)uVar5][1];
  if ((int)(uVar5 + 1) < iVar4) {
    memset(padVar3 + (long)(int)uVar5 + 1,0,(ulong)((iVar4 - uVar5) - 2) * 0x10 + 0x10);
  }
  pfVar9 = &minimum_phase->forward_fft;
  puVar10 = auStackY_68;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar10 = *(undefined8 *)pfVar9;
    pfVar9 = (fft_plan *)((long)pfVar9 + (ulong)bVar11 * -0x10 + 8);
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  p_00.c_out = (fft_complex *)in_stack_ffffffffffffffe0;
  p_00.n = in_stack_ffffffffffffffc0._0_4_;
  p_00.sign = in_stack_ffffffffffffffc0._4_4_;
  p_00.flags = in_stack_ffffffffffffffc0._8_4_;
  p_00._12_4_ = in_stack_ffffffffffffffc0._12_4_;
  p_00.c_in = (fft_complex *)in_stack_ffffffffffffffc0._16_8_;
  p_00.in = (double *)in_stack_ffffffffffffffc0._24_8_;
  p_00.out = (double *)unaff_RBX;
  p_00.input = (double *)unaff_R14;
  p_00.ip = (int *)unaff_R15;
  p_00.w = unaff_retaddr;
  fft_execute(p_00);
  iVar4 = minimum_phase->fft_size;
  if (-2 < iVar4) {
    lVar6 = -1;
    lVar7 = 0;
    do {
      dVar12 = exp(*(double *)((long)*minimum_phase->minimum_phase_spectrum + lVar7) / (double)iVar4
                  );
      dVar13 = cos(*(double *)((long)*minimum_phase->minimum_phase_spectrum + lVar7 + 8) /
                   (double)minimum_phase->fft_size);
      padVar3 = minimum_phase->minimum_phase_spectrum;
      *(double *)((long)*padVar3 + lVar7) = dVar13 * dVar12;
      dVar13 = sin(*(double *)((long)*padVar3 + lVar7 + 8) / (double)minimum_phase->fft_size);
      *(double *)((long)*minimum_phase->minimum_phase_spectrum + lVar7 + 8) = dVar13 * dVar12;
      iVar4 = minimum_phase->fft_size;
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4 / 2);
  }
  return;
}

Assistant:

void GetMinimumPhaseSpectrum(const MinimumPhaseAnalysis *minimum_phase) {
  // Mirroring
  for (int i = minimum_phase->fft_size / 2 + 1;
      i < minimum_phase->fft_size; ++i)
    minimum_phase->log_spectrum[i] =
    minimum_phase->log_spectrum[minimum_phase->fft_size - i];

  // This fft_plan carries out "forward" FFT.
  // To carriy out the Inverse FFT, the sign of imaginary part
  // is inverted after FFT.
  fft_execute(minimum_phase->inverse_fft);
  minimum_phase->cepstrum[0][1] *= -1.0;
  for (int i = 1; i < minimum_phase->fft_size / 2; ++i) {
    minimum_phase->cepstrum[i][0] *= 2.0;
    minimum_phase->cepstrum[i][1] *= -2.0;
  }
  minimum_phase->cepstrum[minimum_phase->fft_size / 2][1] *= -1.0;
  for (int i = minimum_phase->fft_size / 2 + 1;
      i < minimum_phase->fft_size; ++i) {
    minimum_phase->cepstrum[i][0] = 0.0;
    minimum_phase->cepstrum[i][1] = 0.0;
  }

  fft_execute(minimum_phase->forward_fft);

  // Since x is complex number, calculation of exp(x) is as following.
  // Note: This FFT library does not keep the aliasing.
  double tmp;
  for (int i = 0; i <= minimum_phase->fft_size / 2; ++i) {
    tmp = exp(minimum_phase->minimum_phase_spectrum[i][0] /
      minimum_phase->fft_size);
    minimum_phase->minimum_phase_spectrum[i][0] = tmp *
      cos(minimum_phase->minimum_phase_spectrum[i][1] /
      minimum_phase->fft_size);
    minimum_phase->minimum_phase_spectrum[i][1] = tmp *
      sin(minimum_phase->minimum_phase_spectrum[i][1] /
      minimum_phase->fft_size);
  }
}